

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

uint64_t __thiscall slang::ast::Type::getSelectableWidth(Type *this)

{
  SymbolKind SVar1;
  Type *this_00;
  FixedSizeUnpackedArrayType *pFVar2;
  UnpackedStructType *pUVar3;
  UnpackedUnionType *pUVar4;
  uint32_t width;
  Type *ct;
  uint local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint64_t local_8;
  
  this_00 = getCanonicalType((Type *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  SVar1 = (this_00->super_Symbol).kind;
  if (SVar1 == FixedSizeUnpackedArrayType) {
    pFVar2 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x10f160a);
    local_8 = pFVar2->selectableWidth;
  }
  else if (SVar1 == UnpackedStructType) {
    pUVar3 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x10f161f);
    local_8 = pUVar3->selectableWidth;
  }
  else if (SVar1 == UnpackedUnionType) {
    pUVar4 = Symbol::as<slang::ast::UnpackedUnionType>((Symbol *)0x10f1637);
    local_8 = pUVar4->selectableWidth;
  }
  else {
    local_24 = getBitWidth(this_00);
    if (local_24 == 0) {
      local_24 = 1;
    }
    local_8 = (uint64_t)local_24;
  }
  return local_8;
}

Assistant:

uint64_t Type::getSelectableWidth() const {
    auto& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
            return ct.as<FixedSizeUnpackedArrayType>().selectableWidth;
        case SymbolKind::UnpackedStructType:
            return ct.as<UnpackedStructType>().selectableWidth;
        case SymbolKind::UnpackedUnionType:
            return ct.as<UnpackedUnionType>().selectableWidth;
        default:
            uint32_t width = ct.getBitWidth();
            return width > 0 ? width : 1;
    }
}